

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunctionNamesCount(BinaryReaderIR *this,Index count)

{
  size_type sVar1;
  Index count_local;
  BinaryReaderIR *this_local;
  
  sVar1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
  if (sVar1 < count) {
    sVar1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
    PrintError(this,"expected function name count (%u) <= function count (%zd)",(ulong)count,sVar1);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFunctionNamesCount(Index count) {
  if (count > module_->funcs.size()) {
    PrintError("expected function name count (%" PRIindex
               ") <= function count (%" PRIzd ")",
               count, module_->funcs.size());
    return Result::Error;
  }
  return Result::Ok;
}